

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

Value * cmFileAPI::ReportCapabilities(void)

{
  Value *pVVar1;
  Value *pVVar2;
  Value *in_RDI;
  Value request;
  Value local_70;
  Value local_48;
  
  Json::Value::Value(in_RDI,objectValue);
  Json::Value::Value(&local_48,arrayValue);
  pVVar1 = Json::Value::operator[](in_RDI,"requests");
  pVVar1 = Json::Value::operator=(pVVar1,&local_48);
  Json::Value::~Value(&local_48);
  Json::Value::Value(&local_48,objectValue);
  Json::Value::Value(&local_70,"codemodel");
  pVVar2 = Json::Value::operator[](&local_48,"kind");
  Json::Value::operator=(pVVar2,&local_70);
  Json::Value::~Value(&local_70);
  Json::Value::Value(&local_70,arrayValue);
  pVVar2 = Json::Value::operator[](&local_48,"version");
  pVVar2 = Json::Value::operator=(pVVar2,&local_70);
  Json::Value::~Value(&local_70);
  BuildVersion(&local_70,2,4);
  Json::Value::append(pVVar2,&local_70);
  Json::Value::~Value(&local_70);
  Json::Value::append(pVVar1,&local_48);
  Json::Value::~Value(&local_48);
  Json::Value::Value(&local_48,objectValue);
  Json::Value::Value(&local_70,"cache");
  pVVar2 = Json::Value::operator[](&local_48,"kind");
  Json::Value::operator=(pVVar2,&local_70);
  Json::Value::~Value(&local_70);
  Json::Value::Value(&local_70,arrayValue);
  pVVar2 = Json::Value::operator[](&local_48,"version");
  pVVar2 = Json::Value::operator=(pVVar2,&local_70);
  Json::Value::~Value(&local_70);
  BuildVersion(&local_70,2,0);
  Json::Value::append(pVVar2,&local_70);
  Json::Value::~Value(&local_70);
  Json::Value::append(pVVar1,&local_48);
  Json::Value::~Value(&local_48);
  Json::Value::Value(&local_48,objectValue);
  Json::Value::Value(&local_70,"cmakeFiles");
  pVVar2 = Json::Value::operator[](&local_48,"kind");
  Json::Value::operator=(pVVar2,&local_70);
  Json::Value::~Value(&local_70);
  Json::Value::Value(&local_70,arrayValue);
  pVVar2 = Json::Value::operator[](&local_48,"version");
  pVVar2 = Json::Value::operator=(pVVar2,&local_70);
  Json::Value::~Value(&local_70);
  BuildVersion(&local_70,1,0);
  Json::Value::append(pVVar2,&local_70);
  Json::Value::~Value(&local_70);
  Json::Value::append(pVVar1,&local_48);
  Json::Value::~Value(&local_48);
  Json::Value::Value(&local_48,objectValue);
  Json::Value::Value(&local_70,"toolchains");
  pVVar2 = Json::Value::operator[](&local_48,"kind");
  Json::Value::operator=(pVVar2,&local_70);
  Json::Value::~Value(&local_70);
  Json::Value::Value(&local_70,arrayValue);
  pVVar2 = Json::Value::operator[](&local_48,"version");
  pVVar2 = Json::Value::operator=(pVVar2,&local_70);
  Json::Value::~Value(&local_70);
  BuildVersion(&local_70,1,0);
  Json::Value::append(pVVar2,&local_70);
  Json::Value::~Value(&local_70);
  Json::Value::append(pVVar1,&local_48);
  Json::Value::~Value(&local_48);
  return in_RDI;
}

Assistant:

Json::Value cmFileAPI::ReportCapabilities()
{
  Json::Value capabilities = Json::objectValue;
  Json::Value& requests = capabilities["requests"] = Json::arrayValue;

  {
    Json::Value request = Json::objectValue;
    request["kind"] = ObjectKindName(ObjectKind::CodeModel);
    Json::Value& versions = request["version"] = Json::arrayValue;
    versions.append(BuildVersion(2, CodeModelV2Minor));
    requests.append(std::move(request)); // NOLINT(*)
  }

  {
    Json::Value request = Json::objectValue;
    request["kind"] = ObjectKindName(ObjectKind::Cache);
    Json::Value& versions = request["version"] = Json::arrayValue;
    versions.append(BuildVersion(2, CacheV2Minor));
    requests.append(std::move(request)); // NOLINT(*)
  }

  {
    Json::Value request = Json::objectValue;
    request["kind"] = ObjectKindName(ObjectKind::CMakeFiles);
    Json::Value& versions = request["version"] = Json::arrayValue;
    versions.append(BuildVersion(1, CMakeFilesV1Minor));
    requests.append(std::move(request)); // NOLINT(*)
  }

  {
    Json::Value request = Json::objectValue;
    request["kind"] = ObjectKindName(ObjectKind::Toolchains);
    Json::Value& versions = request["version"] = Json::arrayValue;
    versions.append(BuildVersion(1, ToolchainsV1Minor));
    requests.append(std::move(request)); // NOLINT(*)
  }

  return capabilities;
}